

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4random.c
# Opt level: O0

int arc4_seed_proc_sys_kernel_random_uuid(void)

{
  int iVar1;
  ssize_t sVar2;
  uint local_e8;
  int nyb;
  int nybbles;
  int i;
  int n;
  int bytes;
  uchar entropy [64];
  char buf [128];
  int fd;
  
  i = 0;
  while( true ) {
    if (0x1f < i) {
      evutil_memclear_(&n,0x40);
      evutil_memclear_(entropy + 0x38,0x80);
      return 0;
    }
    iVar1 = evutil_open_closeonexec_("/proc/sys/kernel/random/uuid",0,0);
    if (iVar1 < 0) {
      return -1;
    }
    sVar2 = read(iVar1,entropy + 0x38,0x80);
    close(iVar1);
    if ((int)sVar2 < 1) {
      return -1;
    }
    memset(&n,0,0x40);
    local_e8 = 0;
    for (nyb = 0; nyb < (int)sVar2; nyb = nyb + 1) {
      iVar1 = EVUTIL_ISXDIGIT_(entropy[(long)nyb + 0x38]);
      if (iVar1 != 0) {
        iVar1 = evutil_hex_char_to_int_(entropy[(long)nyb + 0x38]);
        if ((local_e8 & 1) == 0) {
          *(byte *)((long)&n + (long)((int)local_e8 / 2)) =
               *(byte *)((long)&n + (long)((int)local_e8 / 2)) | (byte)(iVar1 << 4);
        }
        else {
          *(byte *)((long)&n + (long)((int)local_e8 / 2)) =
               *(byte *)((long)&n + (long)((int)local_e8 / 2)) | (byte)iVar1;
        }
        local_e8 = local_e8 + 1;
      }
    }
    if ((int)local_e8 < 2) break;
    arc4_addrandom((uchar *)&n,(int)local_e8 / 2);
    i = (int)local_e8 / 2 + i;
  }
  return -1;
}

Assistant:

static int
arc4_seed_proc_sys_kernel_random_uuid(void)
{
	/* Occasionally, somebody will make /proc/sys accessible in a chroot,
	 * but not /dev/urandom.  Let's try /proc/sys/kernel/random/uuid.
	 * Its format is stupid, so we need to decode it from hex.
	 */
	int fd;
	char buf[128];
	unsigned char entropy[64];
	int bytes, n, i, nybbles;
	for (bytes = 0; bytes<ADD_ENTROPY; ) {
		fd = evutil_open_closeonexec_("/proc/sys/kernel/random/uuid", O_RDONLY, 0);
		if (fd < 0)
			return -1;
		n = read(fd, buf, sizeof(buf));
		close(fd);
		if (n<=0)
			return -1;
		memset(entropy, 0, sizeof(entropy));
		for (i=nybbles=0; i<n; ++i) {
			if (EVUTIL_ISXDIGIT_(buf[i])) {
				int nyb = evutil_hex_char_to_int_(buf[i]);
				if (nybbles & 1) {
					entropy[nybbles/2] |= nyb;
				} else {
					entropy[nybbles/2] |= nyb<<4;
				}
				++nybbles;
			}
		}
		if (nybbles < 2)
			return -1;
		arc4_addrandom(entropy, nybbles/2);
		bytes += nybbles/2;
	}
	evutil_memclear_(entropy, sizeof(entropy));
	evutil_memclear_(buf, sizeof(buf));
	return 0;
}